

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QComboBox::setIconSize(QComboBox *this,QSize *size)

{
  QComboBoxPrivate *this_00;
  undefined4 in_EAX;
  QComboBoxPrivateContainer *pQVar1;
  QComboBoxPrivate *d;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  
  this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
  iVar3 = -(uint)((this_00->iconSize).wd.m_i == (*size).wd.m_i);
  iVar4 = -(uint)((this_00->iconSize).ht.m_i == (*size).ht.m_i);
  auVar2._4_4_ = iVar3;
  auVar2._0_4_ = iVar3;
  auVar2._8_4_ = iVar4;
  auVar2._12_4_ = iVar4;
  iVar3 = movmskpd(in_EAX,auVar2);
  if (iVar3 == 3) {
    return;
  }
  pQVar1 = QComboBoxPrivate::viewContainer(this_00);
  QAbstractItemView::setIconSize((QAbstractItemView *)pQVar1->view,size);
  this_00->iconSize = *size;
  (this_00->sizeHint).wd = -1;
  (this_00->sizeHint).ht = -1;
  QWidget::updateGeometry(&this->super_QWidget);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }